

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

Path * pathSolve(int *param_1,int *param_2,int param_3,int param_4)

{
  _Bool _Var1;
  TileNode *pTVar2;
  long lVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined8 auStack_588 [158];
  int *local_98;
  int *local_90;
  int local_84;
  int *local_80;
  int *local_78;
  int local_6c;
  int *local_68;
  int *local_60;
  int local_54;
  int *local_50;
  int *local_48;
  int local_3c;
  undefined8 *local_38;
  int local_30;
  int local_2c;
  int beingChecked;
  int nextPosition;
  int j;
  int i;
  int currentPosition_local;
  int count_local;
  int *prevChecked_local;
  Path *path_local;
  
  bVar7 = 0;
  local_38 = (undefined8 *)&stack0x00000008;
  nextPosition = (param_4 + -1) / 0x48;
  beingChecked = param_4 + nextPosition * -0x48;
  local_30 = (nextPosition + 1) * 0x48 + beingChecked;
  j = param_4;
  i = param_3;
  _currentPosition_local = param_2;
  prevChecked_local = param_1;
  _Var1 = beenChecked(param_2,local_30);
  if ((!_Var1) &&
     (_Var1 = isPathCharacter(*(char *)((long)local_38 +
                                       (long)beingChecked + (long)(nextPosition + 1) * 0x49 + 0x4c))
     , _Var1)) {
    local_2c = j + 0x48;
    _currentPosition_local[i] = j;
    pTVar2 = createTileNode(j,*(char *)((long)local_38 +
                                       (long)beingChecked + (long)(nextPosition + 1) * 0x49 + 0x4c))
    ;
    pushToPath(pTVar2,(Path *)prevChecked_local);
    local_48 = prevChecked_local;
    local_50 = _currentPosition_local;
    iVar4 = i + 1;
    local_3c = local_2c;
    puVar5 = local_38;
    puVar6 = auStack_588;
    for (lVar3 = 0x9e; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    pathSolve(local_48,local_50,iVar4,local_3c);
  }
  local_30 = nextPosition * 0x48 + beingChecked + 1;
  _Var1 = beenChecked(_currentPosition_local,local_30);
  if ((!_Var1) &&
     (_Var1 = isPathCharacter(*(char *)((long)local_38 +
                                       (long)(beingChecked + 1) + (long)nextPosition * 0x49 + 0x4c))
     , _Var1)) {
    local_2c = j + 1;
    _currentPosition_local[i] = j;
    pTVar2 = createTileNode(j,*(char *)((long)local_38 +
                                       (long)(beingChecked + 1) + (long)nextPosition * 0x49 + 0x4c))
    ;
    pushToPath(pTVar2,(Path *)prevChecked_local);
    local_60 = prevChecked_local;
    local_68 = _currentPosition_local;
    iVar4 = i + 1;
    local_54 = local_2c;
    puVar5 = local_38;
    puVar6 = auStack_588;
    for (lVar3 = 0x9e; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    pathSolve(local_60,local_68,iVar4,local_54);
  }
  local_30 = (nextPosition + -1) * 0x48 + beingChecked;
  if (((0 < nextPosition) && (_Var1 = beenChecked(_currentPosition_local,local_30), !_Var1)) &&
     (_Var1 = isPathCharacter(*(char *)((long)local_38 +
                                       (long)beingChecked + (long)(nextPosition + -1) * 0x49 + 0x4c)
                             ), _Var1)) {
    local_2c = j + -0x48;
    _currentPosition_local[i] = j;
    pTVar2 = createTileNode(j,*(char *)((long)local_38 +
                                       (long)beingChecked + (long)(nextPosition + -1) * 0x49 + 0x4c)
                           );
    pushToPath(pTVar2,(Path *)prevChecked_local);
    local_78 = prevChecked_local;
    local_80 = _currentPosition_local;
    iVar4 = i + 1;
    local_6c = local_2c;
    puVar5 = local_38;
    puVar6 = auStack_588;
    for (lVar3 = 0x9e; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    pathSolve(local_78,local_80,iVar4,local_6c);
  }
  local_30 = nextPosition * 0x48 + beingChecked + -1;
  if (((0 < beingChecked) && (_Var1 = beenChecked(_currentPosition_local,local_30), !_Var1)) &&
     (_Var1 = isPathCharacter(*(char *)((long)local_38 +
                                       (long)(beingChecked + -1) + (long)nextPosition * 0x49 + 0x4c)
                             ), _Var1)) {
    local_2c = j + -1;
    _currentPosition_local[i] = j;
    pTVar2 = createTileNode(j,*(char *)((long)local_38 +
                                       (long)beingChecked + (long)nextPosition * 0x49 + 0x4c));
    pushToPath(pTVar2,(Path *)prevChecked_local);
    local_90 = prevChecked_local;
    local_98 = _currentPosition_local;
    iVar4 = i + 1;
    local_84 = local_2c;
    puVar5 = local_38;
    puVar6 = auStack_588;
    for (lVar3 = 0x9e; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    pathSolve(local_90,local_98,iVar4,local_84);
  }
  return (Path *)prevChecked_local;
}

Assistant:

struct Path *pathSolve(struct Map map, struct Path *path, int prevChecked[],
    int count, int currentPosition) {
    int i, j, nextPosition, beingChecked;

    i = (currentPosition - 1) / MAP_COLS;
    j = currentPosition - (MAP_COLS * i);

    beingChecked = ((i + 1) * MAP_COLS) + j;

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i + 1][j])) {
        nextPosition = currentPosition + MAP_COLS;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i + 1][j]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = (i * MAP_COLS) + (j + 1);

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i][j + 1])) {
        nextPosition = currentPosition + 1;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i][j + 1]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = ((i - 1) * MAP_COLS) + j;

    if (i > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i - 1][j])) {
            nextPosition = currentPosition - MAP_COLS;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i - 1][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    beingChecked = (i * MAP_COLS) + (j - 1);

    if (j > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i][j - 1])) {
            nextPosition = currentPosition - 1;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    return path;
}